

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.cpp
# Opt level: O1

void __thiscall
OpenMD::StuntDouble::combineForcesAndTorques
          (StuntDouble *this,Snapshot *snapA,Snapshot *snapB,RealType multA,RealType multB)

{
  double *pdVar1;
  DataStoragePointer DVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result;
  double local_c8 [4];
  double local_a8 [4];
  double local_88 [4];
  double local_68 [4];
  double local_48 [4];
  double local_28;
  double local_20;
  
  local_28 = multB;
  local_20 = multA;
  uVar4 = DataStorage::getStorageLayout
                    ((DataStorage *)
                     ((long)&(this->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + this->storage_));
  if ((uVar4 & 4) != 0) {
    DVar2 = this->storage_;
    lVar5 = (long)this->localIndex_;
    lVar6 = *(long *)((long)&(snapA->atomData).force.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar2);
    lVar3 = lVar5 * 0x18;
    local_48[2] = (double)*(undefined8 *)(lVar6 + 0x10 + lVar3);
    pdVar1 = (double *)(lVar6 + lVar3);
    local_48[0] = *pdVar1;
    local_48[1] = pdVar1[1];
    lVar6 = *(long *)((long)&(snapB->atomData).force.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar2);
    local_68[2] = (double)*(undefined8 *)(lVar6 + 0x10 + lVar3);
    pdVar1 = (double *)(lVar6 + lVar3);
    local_68[0] = *pdVar1;
    local_68[1] = pdVar1[1];
    local_88[0] = 0.0;
    local_88[1] = 0.0;
    local_88[2] = 0.0;
    lVar6 = 0;
    do {
      local_88[lVar6] = local_48[lVar6] * local_20;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_a8[2] = 0.0;
    lVar6 = 0;
    do {
      local_a8[lVar6] = local_68[lVar6] * local_28;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    local_c8[2] = 0.0;
    lVar6 = 0;
    do {
      local_c8[lVar6] = local_88[lVar6] + local_a8[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar6 = *(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).force.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar2);
    *(double *)(lVar6 + 0x10 + lVar5 * 0x18) = local_c8[2];
    pdVar1 = (double *)(lVar6 + lVar5 * 0x18);
    *pdVar1 = local_c8[0];
    pdVar1[1] = local_c8[1];
  }
  if ((uVar4 & 0x20) != 0) {
    DVar2 = this->storage_;
    lVar5 = (long)this->localIndex_;
    lVar6 = *(long *)((long)&(snapA->atomData).torque.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar2);
    lVar3 = lVar5 * 0x18;
    local_48[2] = (double)*(undefined8 *)(lVar6 + 0x10 + lVar3);
    pdVar1 = (double *)(lVar6 + lVar3);
    local_48[0] = *pdVar1;
    local_48[1] = pdVar1[1];
    lVar6 = *(long *)((long)&(snapB->atomData).torque.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar2);
    local_68[2] = (double)*(undefined8 *)(lVar6 + 0x10 + lVar3);
    pdVar1 = (double *)(lVar6 + lVar3);
    local_68[0] = *pdVar1;
    local_68[1] = pdVar1[1];
    local_88[0] = 0.0;
    local_88[1] = 0.0;
    local_88[2] = 0.0;
    lVar6 = 0;
    do {
      local_88[lVar6] = local_48[lVar6] * local_20;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_a8[2] = 0.0;
    lVar6 = 0;
    do {
      local_a8[lVar6] = local_68[lVar6] * local_28;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    local_c8[2] = 0.0;
    lVar6 = 0;
    do {
      local_c8[lVar6] = local_88[lVar6] + local_a8[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar6 = *(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).torque.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar2);
    *(double *)(lVar6 + 0x10 + lVar5 * 0x18) = local_c8[2];
    pdVar1 = (double *)(lVar6 + lVar5 * 0x18);
    *pdVar1 = local_c8[0];
    pdVar1[1] = local_c8[1];
  }
  if ((uVar4 & 0x40) != 0) {
    lVar6 = (long)this->localIndex_;
    DVar2 = this->storage_;
    *(double *)
     (*(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).particlePot.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + DVar2) + lVar6 * 8) =
         *(double *)
          (*(long *)((long)&(snapA->atomData).particlePot.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + DVar2) + lVar6 * 8) * local_20 +
         *(double *)
          (*(long *)((long)&(snapB->atomData).particlePot.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + DVar2) + lVar6 * 8) * local_28;
  }
  if ((uVar4 >> 0x10 & 1) != 0) {
    lVar6 = (long)this->localIndex_;
    DVar2 = this->storage_;
    *(double *)
     (*(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).flucQFrc.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + DVar2) + lVar6 * 8) =
         *(double *)
          (*(long *)((long)&(snapA->atomData).flucQFrc.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + DVar2) + lVar6 * 8) * local_20 +
         *(double *)
          (*(long *)((long)&(snapB->atomData).flucQFrc.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + DVar2) + lVar6 * 8) * local_28;
  }
  if ((uVar4 >> 0xc & 1) != 0) {
    DVar2 = this->storage_;
    lVar5 = (long)this->localIndex_;
    lVar6 = *(long *)((long)&(snapA->atomData).electricField.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar2);
    lVar3 = lVar5 * 0x18;
    local_48[2] = (double)*(undefined8 *)(lVar6 + 0x10 + lVar3);
    pdVar1 = (double *)(lVar6 + lVar3);
    local_48[0] = *pdVar1;
    local_48[1] = pdVar1[1];
    lVar6 = *(long *)((long)&(snapB->atomData).electricField.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar2);
    local_68[2] = (double)*(undefined8 *)(lVar6 + 0x10 + lVar3);
    pdVar1 = (double *)(lVar6 + lVar3);
    local_68[0] = *pdVar1;
    local_68[1] = pdVar1[1];
    local_88[0] = 0.0;
    local_88[1] = 0.0;
    local_88[2] = 0.0;
    lVar6 = 0;
    do {
      local_88[lVar6] = local_48[lVar6] * local_20;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_a8[0] = 0.0;
    local_a8[1] = 0.0;
    local_a8[2] = 0.0;
    lVar6 = 0;
    do {
      local_a8[lVar6] = local_68[lVar6] * local_28;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    local_c8[2] = 0.0;
    lVar6 = 0;
    do {
      local_c8[lVar6] = local_88[lVar6] + local_a8[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar6 = *(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).electricField.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar2);
    *(double *)(lVar6 + 0x10 + lVar5 * 0x18) = local_c8[2];
    pdVar1 = (double *)(lVar6 + lVar5 * 0x18);
    *pdVar1 = local_c8[0];
    pdVar1[1] = local_c8[1];
  }
  if ((uVar4 >> 0x11 & 1) != 0) {
    lVar6 = (long)this->localIndex_;
    DVar2 = this->storage_;
    *(double *)
     (*(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).sitePotential.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + DVar2) + lVar6 * 8) =
         local_20 *
         *(double *)
          (*(long *)((long)&(snapA->atomData).sitePotential.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + DVar2) + lVar6 * 8) +
         local_28 *
         *(double *)
          (*(long *)((long)&(snapB->atomData).sitePotential.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + DVar2) + lVar6 * 8);
  }
  return;
}

Assistant:

void StuntDouble::combineForcesAndTorques(Snapshot* snapA, Snapshot* snapB,
                                            RealType multA, RealType multB) {
    int sl = (snapshotMan_->getCurrentSnapshot()->*storage_).getStorageLayout();

    assert(sl == (snapA->*storage_).getStorageLayout());
    assert(sl == (snapB->*storage_).getStorageLayout());

    if (sl & DataStorage::dslForce) {
      Vector3d forceA = (snapA->*storage_).force[localIndex_];
      Vector3d forceB = (snapB->*storage_).force[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_).force[localIndex_] =
          multA * forceA + multB * forceB;
    }

    if (sl & DataStorage::dslTorque) {
      Vector3d torqueA = (snapA->*storage_).torque[localIndex_];
      Vector3d torqueB = (snapB->*storage_).torque[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_).torque[localIndex_] =
          multA * torqueA + multB * torqueB;
    }

    if (sl & DataStorage::dslParticlePot) {
      RealType particlePotA = (snapA->*storage_).particlePot[localIndex_];
      RealType particlePotB = (snapB->*storage_).particlePot[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .particlePot[localIndex_] =
          multA * particlePotA + multB * particlePotB;
    }

    if (sl & DataStorage::dslFlucQForce) {
      RealType flucQFrcA = (snapA->*storage_).flucQFrc[localIndex_];
      RealType flucQFrcB = (snapB->*storage_).flucQFrc[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_).flucQFrc[localIndex_] =
          multA * flucQFrcA + multB * flucQFrcB;
    }

    if (sl & DataStorage::dslElectricField) {
      Vector3d electricFieldA = (snapA->*storage_).electricField[localIndex_];
      Vector3d electricFieldB = (snapB->*storage_).electricField[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .electricField[localIndex_] =
          multA * electricFieldA + multB * electricFieldB;
    }

    if (sl & DataStorage::dslSitePotential) {
      RealType sitePotentialA = (snapA->*storage_).sitePotential[localIndex_];
      RealType sitePotentialB = (snapB->*storage_).sitePotential[localIndex_];

      ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .sitePotential[localIndex_] =
          multA * sitePotentialA + multB * sitePotentialB;
    }
  }